

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O0

TString * anon_unknown.dwarf_8326cb::AppendTypeName
                    (TString *s,char *argOrder,char *argType,int dim0,int dim1)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char __c;
  char cVar9;
  int iVar10;
  char *__s;
  char *local_a8;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char dim1Char;
  char dim0Char;
  int fixedVecSize;
  char order;
  char type;
  bool isSubpass;
  bool isImage;
  bool isBuffer;
  bool isMS;
  bool isSampler;
  bool isArrayed;
  bool isTexture;
  bool isTranspose;
  int dim1_local;
  int dim0_local;
  char *argType_local;
  char *argOrder_local;
  TString *s_local;
  
  cVar1 = *argOrder;
  _isSubpass = dim1;
  _isSampler = dim0;
  _dim1_local = argType;
  argType_local = argOrder;
  argOrder_local = (char *)s;
  bVar2 = IsTextureType(*argOrder);
  bVar3 = IsArrayed(*argType_local);
  bVar4 = IsSamplerType(*_dim1_local);
  bVar5 = IsMS(*argType_local);
  bVar6 = IsBuffer(*argType_local);
  bVar7 = IsImage(*argType_local);
  bVar8 = IsSubpassInput(*argType_local);
  dim0Char = *_dim1_local;
  if (cVar1 == '^') {
    std::swap<int>((int *)&isSampler,(int *)&isSubpass);
  }
  else if ((bVar2) || (bVar8)) {
    if (dim0Char == 'F') {
      dim0Char = 'T';
    }
    else if (dim0Char == 'I') {
      dim0Char = 'i';
    }
    else if (dim0Char == 'U') {
      dim0Char = 'u';
    }
  }
  if (cVar1 == '^') {
    argType_local = argType_local + 1;
  }
  cVar1 = *argType_local;
  switch(dim0Char) {
  case '-':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"void");
    break;
  default:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"UNKNOWN_TYPE");
    break;
  case 'B':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"bool");
    break;
  case 'D':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"double");
    break;
  case 'F':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"float");
    break;
  case 'I':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"int");
    break;
  case 'L':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"int64_t");
    break;
  case 'M':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"uint64_t");
    break;
  case 'S':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"sampler");
    break;
  case 'T':
    if ((bVar6) && (bVar7)) {
      local_58 = "RWBuffer";
    }
    else {
      if (bVar8) {
        local_60 = "SubpassInput";
      }
      else {
        if (bVar6) {
          local_68 = "Buffer";
        }
        else {
          local_68 = "Texture";
          if (bVar7) {
            local_68 = "RWTexture";
          }
        }
        local_60 = local_68;
      }
      local_58 = local_60;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,local_58);
    break;
  case 'U':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"uint");
    break;
  case 'i':
    if ((bVar6) && (bVar7)) {
      local_70 = "RWBuffer";
    }
    else {
      if (bVar8) {
        local_78 = "SubpassInput";
      }
      else {
        if (bVar6) {
          local_80 = "Buffer";
        }
        else {
          local_80 = "Texture";
          if (bVar7) {
            local_80 = "RWTexture";
          }
        }
        local_78 = local_80;
      }
      local_70 = local_78;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,local_70);
    break;
  case 's':
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"SamplerComparisonState");
    break;
  case 'u':
    if ((bVar6) && (bVar7)) {
      local_88 = "RWBuffer";
    }
    else {
      if (bVar8) {
        local_90 = "SubpassInput";
      }
      else {
        if (bVar6) {
          local_98 = "Buffer";
        }
        else {
          local_98 = "Texture";
          if (bVar7) {
            local_98 = "RWTexture";
          }
        }
        local_90 = local_98;
      }
      local_88 = local_90;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,local_88);
  }
  if ((bVar8) && (bVar5)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"MS");
  }
  iVar10 = FixedVecSize(argType_local);
  if (iVar10 != 0) {
    _isSubpass = iVar10;
    _isSampler = iVar10;
  }
  __c = (char)_isSampler + '0';
  cVar9 = (char)_isSubpass;
  if ((bVar4) || (bVar2)) {
    if (((cVar1 == 'V') || (bVar2)) && (!bVar6)) {
      switch(_isSampler) {
      case 1:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   argOrder_local,"1D");
        break;
      case 2:
        __s = "2D";
        if (bVar5) {
          __s = "2DMS";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   argOrder_local,__s);
        break;
      case 3:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   argOrder_local,"3D");
        break;
      case 4:
        if (dim0Char == 'S') {
          local_a8 = "CUBE";
        }
        else {
          local_a8 = "Cube";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   argOrder_local,local_a8);
        break;
      default:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   argOrder_local,"UNKNOWN_SAMPLER");
      }
    }
  }
  else {
    if ((((cVar1 == 'V') || (cVar1 == 'M')) && ((_isSampler < 1 || (4 < _isSampler)))) ||
       ((cVar1 == 'M' && ((_isSubpass < 1 || (4 < _isSubpass)))))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 argOrder_local,"UNKNOWN_DIMENSION");
      return (TString *)argOrder_local;
    }
    if (cVar1 != '-') {
      if (cVar1 == 'M') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   argOrder_local,__c);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   argOrder_local,'x');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   argOrder_local,cVar9 + '0');
      }
      else if ((cVar1 != 'S') && (cVar1 == 'V')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   argOrder_local,__c);
      }
    }
  }
  if (bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"Array");
  }
  if (dim0Char == 'T') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"<float");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,__c);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,">");
  }
  else if (dim0Char == 'i') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"<int");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,__c);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,">");
  }
  else if (dim0Char == 'u') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,"<uint");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,__c);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               argOrder_local,">");
  }
  return (TString *)argOrder_local;
}

Assistant:

glslang::TString& AppendTypeName(glslang::TString& s, const char* argOrder, const char* argType, int dim0, int dim1)
{
    const bool isTranspose = (argOrder[0] == '^');
    const bool isTexture   = IsTextureType(argOrder[0]);
    const bool isArrayed   = IsArrayed(argOrder[0]);
    const bool isSampler   = IsSamplerType(argType[0]);
    const bool isMS        = IsMS(argOrder[0]);
    const bool isBuffer    = IsBuffer(argOrder[0]);
    const bool isImage     = IsImage(argOrder[0]);
    const bool isSubpass   = IsSubpassInput(argOrder[0]);

    char type  = *argType;

    if (isTranspose) {  // Take transpose of matrix dimensions
        std::swap(dim0, dim1);
    } else if (isTexture || isSubpass) {
        if (type == 'F')       // map base type to texture of that type.
            type = 'T';        // e.g, int -> itexture, uint -> utexture, etc.
        else if (type == 'I')
            type = 'i';
        else if (type == 'U')
            type = 'u';
    }

    if (isTranspose)
        ++argOrder;

    char order = *argOrder;

    switch (type) {
    case '-': s += "void";                                break;
    case 'F': s += "float";                               break;
    case 'D': s += "double";                              break;
    case 'I': s += "int";                                 break;
    case 'U': s += "uint";                                break;
    case 'L': s += "int64_t";                             break;
    case 'M': s += "uint64_t";                            break;
    case 'B': s += "bool";                                break;
    case 'S': s += "sampler";                             break;
    case 's': s += "SamplerComparisonState";              break;
    case 'T': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage  ? "RWTexture" : "Texture");  break;
    case 'i': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage ? "RWTexture" : "Texture");   break;
    case 'u': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage ? "RWTexture" : "Texture");   break;
    default:  s += "UNKNOWN_TYPE";                        break;
    }

    if (isSubpass && isMS)
        s += "MS";

    // handle fixed vector sizes, such as float3, and only ever 3.
    const int fixedVecSize = FixedVecSize(argOrder);
    if (fixedVecSize != 0)
        dim0 = dim1 = fixedVecSize;

    const char dim0Char = ('0' + char(dim0));
    const char dim1Char = ('0' + char(dim1));

    // Add sampler dimensions
    if (isSampler || isTexture) {
        if ((order == 'V' || isTexture) && !isBuffer) {
            switch (dim0) {
            case 1: s += "1D";                   break;
            case 2: s += (isMS ? "2DMS" : "2D"); break;
            case 3: s += "3D";                   break;
            case 4: s += (type == 'S'? "CUBE" : "Cube"); break;
            default: s += "UNKNOWN_SAMPLER";     break;
            }
        }
    } else {
        // Non-sampler type:
        // verify dimensions
        if (((order == 'V' || order == 'M') && (dim0 < 1 || dim0 > 4)) ||
            (order == 'M' && (dim1 < 1 || dim1 > 4))) {
            s += "UNKNOWN_DIMENSION";
            return s;
        }

        switch (order) {
        case '-': break;  // no dimensions for voids
        case 'S': break;  // no dimensions on scalars
        case 'V':
            s += dim0Char;
            break;
        case 'M':
            s += dim0Char;
            s += 'x';
            s += dim1Char;
            break;
        default:
            break;
        }
    }

    // handle arrayed textures
    if (isArrayed)
        s += "Array";

    switch (type) {
    case 'i': s += "<int";   s += dim0Char; s += ">"; break;
    case 'u': s += "<uint";  s += dim0Char; s += ">"; break;
    case 'T': s += "<float"; s += dim0Char; s += ">"; break;
    default: break;
    }

    return s;
}